

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_systemv.cpp
# Opt level: O2

bool __thiscall
QSystemSemaphoreSystemV::modifySemaphore
          (QSystemSemaphoreSystemV *this,QSystemSemaphorePrivate *self,int count)

{
  bool bVar1;
  key_t kVar2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QLatin1StringView function;
  sembuf local_36;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  kVar2 = handle(this,self,Open);
  if (kVar2 != -1) {
    local_36.sem_num = 0;
    local_36.sem_op = (short)count;
    local_36.sem_flg = 0x1000;
    do {
      iVar3 = semop(this->semaphore,&local_36,1);
      if (iVar3 != -1) {
        QSystemSemaphorePrivate::clearError(self);
        bVar1 = true;
        goto LAB_0043cbc2;
      }
      piVar4 = __errno_location();
      iVar3 = *piVar4;
    } while (iVar3 == 4);
    if ((iVar3 == 0x2b) || (iVar3 == 0x16)) {
      this->semaphore = -1;
      cleanHandle(this,self);
      handle(this,self,Open);
      bVar1 = modifySemaphore(this,self,count);
    }
    else {
      function.m_data = "QSystemSemaphore::modifySemaphore";
      function.m_size = 0x21;
      QSystemSemaphorePrivate::setUnixErrorString(self,function);
      bVar1 = false;
    }
  }
LAB_0043cbc2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphoreSystemV::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (handle(self, QSystemSemaphore::Open) == -1)
        return false;

    struct sembuf operation;
    operation.sem_num = 0;
    operation.sem_op = count;
    operation.sem_flg = SEM_UNDO;

    int res;
    QT_EINTR_LOOP(res, semop(semaphore, &operation, 1));
    if (-1 == res) {
        // If the semaphore was removed be nice and create it and then modifySemaphore again
        if (errno == EINVAL || errno == EIDRM) {
            semaphore = -1;
            cleanHandle(self);
            handle(self, QSystemSemaphore::Open);
            return modifySemaphore(self, count);
        }
        self->setUnixErrorString("QSystemSemaphore::modifySemaphore"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
        qDebug("QSystemSemaphoreSystemV::modify failed %d %d %d %d %d",
               count, int(semctl(semaphore, 0, GETVAL)), int(errno), int(EIDRM), int(EINVAL);
#endif
        return false;
    }

    self->clearError();
    return true;
}